

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
 __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Tuple_impl<0UL,_testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<libaom_test::TestMode>,_testing::internal::ValueArray<int,_int,_int,_int,_int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  PVar1;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  local_80;
  
  this_00 = (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
             *)operator_new(0x68);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
  ::
  _Tuple_impl<testing::internal::ValueArray<libaom_test::CodecFactory_const*>,testing::internal::ValueArray<libaom_test::TestMode>,testing::internal::ValueArray<int,int,int,int,int,int>,testing::internal::ValueArray<int,int>,testing::internal::ValueArray<int,int>,testing::internal::ValueArray<int,int>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
              *)&local_80,in_RSI);
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
  ::CartesianProductGenerator
            (this_00,(tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                      *)&local_80);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>>const,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                      *)this_00);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  ::~_Tuple_impl(&local_80);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }